

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

pair<unsigned_int,_Bitvec08x16> *
anon_unknown.dwarf_11362::SolverDpllTriadSimd<1>::ChooseBandAndValueToBranch(State *state)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Bitvec08x16 *in_RSI;
  pair<unsigned_int,_Bitvec08x16> *in_RDI;
  Cells08 only_three;
  Cells08 only_two;
  Cells08 four;
  Cells08 three;
  Cells08 two;
  Cells08 rotated;
  Cells08 shuffle_rotate;
  Cells08 one;
  Cells08 *configurations;
  uint32_t config_minpos;
  uint32_t best_value_count;
  uint32_t best_value;
  uint32_t best_band_count;
  uint32_t best_band;
  uint16_t x05;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined4 in_stack_fffffffffffffdec;
  undefined2 uVar10;
  undefined2 uVar11;
  undefined4 in_stack_fffffffffffffdf4;
  pair<unsigned_int,_Bitvec08x16> *this;
  Bitvec08x16 local_1a8 [2];
  Bitvec08x16 local_188 [4];
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_78;
  undefined8 local_70;
  Bitvec08x16 local_68;
  Bitvec08x16 local_58;
  Bitvec08x16 *local_40;
  Bitvec08x16 local_38;
  uint32_t local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  uint local_14;
  Bitvec08x16 *local_10;
  
  local_14 = 0xffffffff;
  local_18 = 0xffffffff;
  local_1c = 0xffffffff;
  local_20 = 0xffffffff;
  this = in_RDI;
  local_10 = in_RSI;
  iVar2 = Bitvec08x16::Popcount(in_RSI);
  iVar3 = Bitvec08x16::Popcount(local_10 + 2);
  iVar4 = Bitvec08x16::Popcount(local_10 + 4);
  iVar5 = Bitvec08x16::Popcount(local_10 + 6);
  iVar6 = Bitvec08x16::Popcount(local_10 + 8);
  iVar7 = Bitvec08x16::Popcount(local_10 + 10);
  x05 = (uint16_t)iVar7;
  uVar8 = 0;
  uVar9 = 0xffff;
  uVar10 = 0;
  Bitvec08x16::Bitvec08x16
            (&local_38,(uint16_t)iVar2,(uint16_t)iVar3,(uint16_t)iVar4,(uint16_t)iVar5,
             (uint16_t)iVar6,x05,0xffff,0xffff);
  local_24 = Bitvec08x16::MinPosGreaterThanOrEqual(&local_38,10);
  if ((local_24 & 0xff00) == 0) {
    local_14 = local_24 >> 0x10;
    local_40 = local_10 +
               (long)*(int *)((anonymous_namespace)::tables + (ulong)local_14 * 4 + 0x18b8) * 6 +
               (long)*(int *)((anonymous_namespace)::tables + (ulong)local_14 * 4 + 0x18dc) * 2;
    Bitvec08x16::Bitvec08x16(&local_58,local_40);
    uVar8 = 0x100;
    uVar9 = 0;
    uVar10 = 0xffff;
    uVar11 = 0;
    Bitvec08x16::Bitvec08x16(&local_68,0x302,0x504,0x706,0x908,0xb0a,0x100,0xffff,0xffff);
    Bitvec08x16::Shuffle((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator&((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator|=((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::Shuffle((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    local_78 = local_98;
    local_70 = local_90;
    Bitvec08x16::operator&((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator&((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator|=((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator|=((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::Shuffle((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    local_78 = local_c8;
    local_70 = local_c0;
    Bitvec08x16::operator&((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator&((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator|=((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator&((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator|=((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator|=((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::Shuffle((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    local_78 = local_108;
    local_70 = local_100;
    Bitvec08x16::operator&((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator|=((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator&((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator|=((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator&((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator|=((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator|=((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::Shuffle((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    local_78 = local_148;
    local_70 = local_140;
    Bitvec08x16::operator&((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator|=((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator&((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator|=((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator&((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::operator|=((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    Bitvec08x16::and_not((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
    bVar1 = Bitvec08x16::AllZero(local_188);
    if (bVar1) {
      Bitvec08x16::and_not((Bitvec08x16 *)this,(Bitvec08x16 *)in_RDI);
      bVar1 = Bitvec08x16::AllZero(local_1a8);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        Bitvec08x16::GetLowBit((Bitvec08x16 *)in_RDI);
        std::pair<unsigned_int,_Bitvec08x16>::pair<unsigned_int_&,_Bitvec08x16,_true>
                  ((pair<unsigned_int,_Bitvec08x16> *)
                   CONCAT44(in_stack_fffffffffffffdf4,CONCAT22(uVar11,uVar10)),
                   (uint *)CONCAT44(in_stack_fffffffffffffdec,CONCAT22(uVar9,uVar8)),
                   (Bitvec08x16 *)0x1155e8);
      }
      else {
        Bitvec08x16::GetLowBit((Bitvec08x16 *)in_RDI);
        std::pair<unsigned_int,_Bitvec08x16>::pair<unsigned_int_&,_Bitvec08x16,_true>
                  ((pair<unsigned_int,_Bitvec08x16> *)
                   CONCAT44(in_stack_fffffffffffffdf4,CONCAT22(uVar11,uVar10)),
                   (uint *)CONCAT44(in_stack_fffffffffffffdec,CONCAT22(uVar9,uVar8)),
                   (Bitvec08x16 *)0x1155bd);
      }
    }
    else {
      Bitvec08x16::GetLowBit((Bitvec08x16 *)in_RDI);
      std::pair<unsigned_int,_Bitvec08x16>::pair<unsigned_int_&,_Bitvec08x16,_true>
                ((pair<unsigned_int,_Bitvec08x16> *)
                 CONCAT44(in_stack_fffffffffffffdf4,CONCAT22(uVar11,uVar10)),
                 (uint *)CONCAT44(in_stack_fffffffffffffdec,CONCAT22(uVar9,uVar8)),
                 (Bitvec08x16 *)0x115562);
    }
  }
  else {
    Bitvec08x16::All((uint16_t)((ulong)in_RDI >> 0x30));
    std::pair<unsigned_int,_Bitvec08x16>::pair<unsigned_int_&,_Bitvec08x16,_true>
              ((pair<unsigned_int,_Bitvec08x16> *)
               CONCAT44(in_stack_fffffffffffffdf4,CONCAT22(uVar10,uVar9)),
               (uint *)CONCAT44(in_stack_fffffffffffffdec,CONCAT22(uVar8,x05)),
               (Bitvec08x16 *)0x11560d);
  }
  return this;
}

Assistant:

static inline pair<uint32_t, Cells08> ChooseBandAndValueToBranch(const State &state) {
        uint32_t best_band = NONE, best_band_count = NONE;
        uint32_t best_value = NONE, best_value_count = NONE;

        // first find the unfixed band with the fewest possible configurations across all values.
        // a minimum unfixed band will have 0 <= count-10 <= 44. if all bands are fixed then the
        // minimum after subtracting 10 and interpreting as a uint will be 0xfffa.
        uint32_t config_minpos = Bitvec08x16{
                (uint16_t)state.bands[0][0].configurations.Popcount(),
                (uint16_t)state.bands[0][1].configurations.Popcount(),
                (uint16_t)state.bands[0][2].configurations.Popcount(),
                (uint16_t)state.bands[1][0].configurations.Popcount(),
                (uint16_t)state.bands[1][1].configurations.Popcount(),
                (uint16_t)state.bands[1][2].configurations.Popcount(),
                (uint16_t)0xffff,
                (uint16_t)0xffff
        }.MinPosGreaterThanOrEqual(10);

        // if we have an unfixed band then find a digit in the band with the fewest possibilities.
        // the approach below is faster than actually counting the configuration for each digit and
        // using MinPosGreaterThanOrEqual as above, but it is inexact in rare cases when all digits
        // have 4 or more configurations. the tradeoff is a net positive for Vanilla Sudoku and a
        // net negative for Pencilmark Sudoku.
        if ((config_minpos & 0xff00u) == 0) {
            best_band = config_minpos >> 16u;
            const auto &configurations =
                    state.bands[tables.div3[best_band]][tables.mod3[best_band]].configurations;
            Cells08 one = configurations;
            Cells08 shuffle_rotate = Cells08{shuf01, shuf02, shuf03, shuf04, shuf05, shuf00, 0xffff, 0xffff};
            Cells08 rotated = one.Shuffle(shuffle_rotate); // 1
            Cells08 two = one & rotated;
            one |= rotated;
            rotated = rotated.Shuffle(shuffle_rotate); // 2
            Cells08 three = two & rotated;
            two |= one & rotated;
            one |= rotated;
            rotated = rotated.Shuffle(shuffle_rotate); // 3
            Cells08 four = three & rotated;
            three |= two & rotated;
            two |= one & rotated;
            one |= rotated;
            rotated = rotated.Shuffle(shuffle_rotate); // 4
            four |= three & rotated;
            three |= two & rotated;
            two |= one & rotated;
            one |= rotated;
            rotated = rotated.Shuffle(shuffle_rotate); // 5
            four |= three & rotated;
            three |= two & rotated;
            two |= one & rotated;

            Cells08 only_two = two.and_not(three);
            if (!LIKELY(only_two.AllZero())) {
                return {best_band, only_two.GetLowBit()};
            } else {
                Cells08 only_three = three.and_not(four);
                if (LIKELY(!only_three.AllZero())) {
                    return {best_band, only_three.GetLowBit()};
                } else {
                    return {best_band, four.GetLowBit()};
                }
            }
        }
        return {best_band, Cells08::All(0)};
    }